

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

int qc_tcp_bind(QcSocket *socket,char *ip,int port)

{
  int iVar1;
  undefined1 local_34 [8];
  sockaddr_in servaddr;
  int port_local;
  char *ip_local;
  QcSocket *socket_local;
  
  servaddr.sin_zero._0_4_ = port;
  unique0x100001f2 = ip;
  if (socket == (QcSocket *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0x7f);
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x7f,"int qc_tcp_bind(QcSocket *, const char *, int)");
  }
  if ((ip == (char *)0x0) &&
     (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x80), stack0xffffffffffffffe0 == (char *)0x0)) {
    __assert_fail("ip",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x80,"int qc_tcp_bind(QcSocket *, const char *, int)");
  }
  if (((int)servaddr.sin_zero._0_4_ < 1) &&
     (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x81), (int)servaddr.sin_zero._0_4_ < 1)) {
    __assert_fail("port>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x81,"int qc_tcp_bind(QcSocket *, const char *, int)");
  }
  local_34._0_2_ = 2;
  local_34._2_2_ = htons(servaddr.sin_zero._0_2_);
  if ((stack0xffffffffffffffe0 == (char *)0x0) ||
     (iVar1 = strcmp(stack0xffffffffffffffe0,"127.0.0.1"), iVar1 == 0)) {
    local_34._4_4_ = htonl(0);
  }
  else {
    local_34._4_4_ = inet_addr(stack0xffffffffffffffe0);
  }
  iVar1 = bind(socket->sockfd,(sockaddr *)local_34,0x10);
  if (iVar1 == 0) {
    socket_local._4_4_ = 0;
  }
  else {
    _qc_perror("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
               ,0x8d,"socket bind failed (ip=%s port=%d)",stack0xffffffffffffffe0,
               (ulong)(uint)servaddr.sin_zero._0_4_);
    socket_local._4_4_ = -1;
  }
  return socket_local._4_4_;
}

Assistant:

int qc_tcp_bind(QcSocket *socket, const char* ip, int port)
{
    struct sockaddr_in servaddr;

    qc_assert(socket);
    qc_assert(ip);
    qc_assert(port>0);

    servaddr.sin_family = AF_INET;
    servaddr.sin_port = htons(port);

    if(NULL == ip || (0 == strcmp(ip, "127.0.0.1")))
        servaddr.sin_addr.s_addr = htonl(INADDR_ANY);
    else
        servaddr.sin_addr.s_addr = inet_addr(ip);

    if(0 != bind(socket->sockfd, (struct sockaddr*)&servaddr, sizeof(servaddr)))
    {
        qc_perror("socket bind failed (ip=%s port=%d)", ip, port);
        return -1;
    }

    return 0;
}